

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

int rw::strcmp_ci(char *s1,char *s2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = tolower((int)*s1);
  iVar2 = tolower((int)*s2);
  iVar3 = (int)(char)uVar1;
  iVar2 = (int)(char)iVar2;
  if (iVar3 == iVar2) {
    lVar4 = 1;
    do {
      if ((uVar1 & 0xff) == 0) {
        return 0;
      }
      uVar1 = tolower((int)s1[lVar4]);
      iVar2 = tolower((int)s2[lVar4]);
      iVar3 = (int)(char)uVar1;
      iVar2 = (int)(char)iVar2;
      lVar4 = lVar4 + 1;
    } while (iVar3 == iVar2);
  }
  return iVar3 - iVar2;
}

Assistant:

int
strcmp_ci(const char *s1, const char *s2)
{
	char c1, c2;
	for(;;){
		c1 = tolower(*s1);
		c2 = tolower(*s2);
		if(c1 != c2)
			return c1 - c2;
		if(c1 == '\0')
			return 0;
		s1++;
		s2++;
	}
}